

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

int_type __thiscall fmt::v5::internal::formatbuf<char>::overflow(formatbuf<char> *this,int_type ch)

{
  bool bVar1;
  char local_19;
  int_type local_18;
  int_type local_14;
  formatbuf<char> *pfStack_10;
  int_type ch_local;
  formatbuf<char> *this_local;
  
  local_14 = ch;
  pfStack_10 = this;
  local_18 = std::char_traits<char>::eof();
  bVar1 = std::char_traits<char>::eq_int_type(&local_14,&local_18);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_19 = (char)local_14;
    basic_buffer<char>::push_back(this->buffer_,&local_19);
  }
  return local_14;
}

Assistant:

int_type overflow(int_type ch = traits_type::eof()) FMT_OVERRIDE {
    if (!traits_type::eq_int_type(ch, traits_type::eof()))
      buffer_.push_back(static_cast<Char>(ch));
    return ch;
  }